

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkt-proc-builder.cpp
# Opt level: O2

void yactfr::internal::buildBasicReadInstr<yactfr::internal::ReadFlSIntInstr>
               (StructureMemberType *memberType,DataType *dt,Proc *baseProc)

{
  StructureMemberType *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  shared_ptr<yactfr::internal::Instr> local_38;
  StructureMemberType *local_20;
  
  local_20 = memberType;
  std::
  make_shared<yactfr::internal::ReadFlSIntInstr,yactfr::StructureMemberType_const*const&,yactfr::DataType_const&>
            (&local_48,(DataType *)&local_20);
  local_38.super___shared_ptr<yactfr::internal::Instr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_48;
  local_38.super___shared_ptr<yactfr::internal::Instr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Stack_40._M_pi;
  local_48 = (StructureMemberType *)0x0;
  _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Proc::pushBack(baseProc,&local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.super___shared_ptr<yactfr::internal::Instr,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_40);
  return;
}

Assistant:

void buildBasicReadInstr(const StructureMemberType * const memberType, const DataType& dt,
                         Proc& baseProc)
{
    baseProc.pushBack(std::make_shared<ReadInstrT>(memberType, dt));
}